

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * prvTidyParseTableTag(TidyDocImpl *doc,Node *table,GetTokenMode mode)

{
  int iVar1;
  uint uVar2;
  Lexer *pLVar3;
  TidyParserMemory *pTVar4;
  TidyParserMemory data;
  undefined1 auVar5 [36];
  Bool BVar6;
  uint uVar7;
  long lVar8;
  Node *node;
  Node *pNVar9;
  Node **ppNVar10;
  TidyParserMemory memory;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  Bool BStack_44;
  
  pLVar3 = doc->lexer;
  if (table == (Node *)0x0) {
    iVar1 = (doc->stack).top;
    lVar8 = (long)iVar1;
    if (lVar8 < 0) {
      table = (Node *)0x0;
      BVar6 = no;
    }
    else {
      pTVar4 = (doc->stack).content;
      table = pTVar4[lVar8].original_node;
      BVar6 = pTVar4[lVar8].register_1;
      (doc->stack).top = iVar1 + -1;
    }
    pLVar3->exiled = BVar6;
  }
  else {
    prvTidyDeferDup(doc);
  }
  uVar2 = pLVar3->istackbase;
  pLVar3->istackbase = pLVar3->istacksize;
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  do {
    if (node == (Node *)0x0) {
      prvTidyReport(doc,table,(Node *)0x0,0x25a);
      pLVar3->istackbase = uVar2;
      return (Node *)0x0;
    }
    if (node->tag == table->tag) {
      if (node->type == EndTag) {
        prvTidyFreeNode(doc,node);
      }
      else {
        prvTidyUngetToken(doc);
        prvTidyReport(doc,table,node,0x27e);
      }
      pLVar3->istackbase = uVar2;
      table->closed = yes;
      return (Node *)0x0;
    }
    BVar6 = InsertMisc(table,node);
    if (BVar6 == no) {
      uStack_60 = SUB84(table,0);
      uStack_5c = (undefined4)((ulong)table >> 0x20);
      if (node->tag == (Dict *)0x0) {
        if (node->type != TextNode) goto LAB_0013f6e8;
LAB_0013f62d:
        BVar6 = prvTidynodeIsText(node);
        if ((BVar6 == no) && (BVar6 = prvTidynodeHasCM(node,0x18), BVar6 == no)) {
          if ((node->tag->model & 4) == 0) goto LAB_0013f5ff;
          MoveToHead(doc,table,node);
        }
        else {
          prvTidyInsertNodeBeforeElement(table,node);
          prvTidyReport(doc,table,node,0x27e);
          pLVar3->exiled = yes;
          if (node->type != TextNode) {
            local_58 = SUB84(node,0);
            uStack_54 = (undefined4)((ulong)node >> 0x20);
            BStack_44 = no;
            goto LAB_0013f8ae;
          }
          pLVar3->exiled = no;
        }
      }
      else {
        if (node->type != EndTag) {
          uVar7 = node->tag->id - TidyTag_TABLE;
          if ((5 < uVar7) || ((0x25U >> (uVar7 & 0x1f) & 1) == 0)) goto LAB_0013f62d;
          prvTidyUngetToken(doc);
          node = prvTidyInferredTag(doc,TidyTag_TR);
          prvTidyReport(doc,table,node,0x261);
        }
LAB_0013f5ff:
        if (node->type == EndTag) {
          if ((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_FORM)) {
            BVar6 = prvTidynodeHasCM(node,0x280);
            if ((BVar6 == no) && (BVar6 = prvTidynodeHasCM(node,0x18), pNVar9 = table, BVar6 == no))
            {
              while (pNVar9 = pNVar9->parent, pNVar9 != (Node *)0x0) {
                if (node->tag == pNVar9->tag) {
                  prvTidyReport(doc,table,node,0x259);
                  prvTidyUngetToken(doc);
                  goto LAB_0013f7e1;
                }
              }
              goto LAB_0013f6ca;
            }
          }
          else {
            *(byte *)&doc->badForm = (byte)doc->badForm | 1;
          }
        }
        else {
LAB_0013f6ca:
          if ((node->tag->model & 0x80) == 0) {
            prvTidyUngetToken(doc);
            prvTidyReport(doc,table,node,0x27e);
LAB_0013f7e1:
            pLVar3->istackbase = uVar2;
            return (Node *)0x0;
          }
          BVar6 = prvTidynodeIsElement(node);
          if (BVar6 != no) {
            node->parent = table;
            if (table == (Node *)0x0) {
              node->prev = (Node *)0x0;
            }
            else {
              pNVar9 = table->last;
              node->prev = pNVar9;
              ppNVar10 = &pNVar9->next;
              if (pNVar9 == (Node *)0x0) {
                ppNVar10 = &table->content;
              }
              *ppNVar10 = node;
              table->last = node;
            }
            BStack_44 = pLVar3->exiled;
            local_58 = SUB84(node,0);
            uStack_54 = (undefined4)((ulong)node >> 0x20);
LAB_0013f8ae:
            auVar5 = ZEXT2436(CONCAT420(uStack_54,
                                        CONCAT416(local_58,CONCAT412(uStack_5c,
                                                                     CONCAT48(uStack_60,
                                                                              prvTidyParseTableTag))
                                                 )));
            data.register_1 = BStack_44;
            data.identity = (Parser *)auVar5._0_8_;
            data.original_node = (Node *)auVar5._8_8_;
            data.reentry_node = (Node *)auVar5._16_8_;
            data.reentry_mode = auVar5._24_4_;
            data.reentry_state = auVar5._28_4_;
            data.mode = auVar5._32_4_;
            data._40_8_ = 0;
            prvTidypushMemory(doc,data);
            return node;
          }
        }
LAB_0013f6e8:
        prvTidyReport(doc,table,node,0x235);
        prvTidyFreeNode(doc,node);
      }
    }
    node = prvTidyGetToken(doc,IgnoreWhitespace);
  } while( true );
}

Assistant:

Node* TY_(ParseTableTag)( TidyDocImpl* doc, Node *table, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node, *parent;
    uint istackbase;
    DEBUG_LOG_COUNTERS;

    if ( table == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        table = memory.original_node;
        lexer->exiled = memory.register_1;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(table);
        TY_(DeferDup)( doc );
    }

    istackbase = lexer->istackbase;
    lexer->istackbase = lexer->istacksize;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        DEBUG_LOG_GOT_TOKEN(node);
        if (node->tag == table->tag )
        {
            if (node->type == EndTag)
            {
                TY_(FreeNode)(doc, node);
            }
            else
            {
                /* Issue #498 - If a <table> in a <table>
                 * just close the current table, and issue a
                 * warning. The previous action was to discard
                 * this second <table>
                 */
                TY_(UngetToken)(doc);
                TY_(Report)(doc, table, node, TAG_NOT_ALLOWED_IN);
            }
            lexer->istackbase = istackbase;
            table->closed = yes;

            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(table, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL && node->type != TextNode)
        {
            TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* if TD or TH or text or inline or block then infer <TR> */

        if (node->type != EndTag)
        {
            if ( nodeIsTD(node) || nodeIsTH(node) || nodeIsTABLE(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_TR);
                TY_(Report)(doc, table, node, MISSING_STARTTAG);
            }
            else if ( TY_(nodeIsText)(node) ||TY_(nodeHasCM)(node,CM_BLOCK|CM_INLINE) )
            {
                TY_(InsertNodeBeforeElement)(table, node);
                TY_(Report)(doc, table, node, TAG_NOT_ALLOWED_IN);
                lexer->exiled = yes;

                if (node->type != TextNode)
                {
                    TidyParserMemory memory = {0};
                    memory.identity = TY_(ParseTableTag);
                    memory.original_node = table;
                    memory.reentry_node = node;
                    memory.register_1 = no; /* later, lexer->exiled = no */
                    memory.mode = IgnoreWhitespace;
                    TY_(pushMemory)( doc, memory );
                    DEBUG_LOG_EXIT_WITH_NODE(node);
                    return node;
                }

                lexer->exiled = no;
                continue;
            }
            else if (node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, table, node);
                continue;
            }
        }

        /*
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            /* best to discard unexpected block/inline end tags */
            if ( TY_(nodeHasCM)(node, CM_TABLE|CM_ROW) ||
                 TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
            {
                TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = table->parent;
                  parent != NULL;
                  parent = parent->parent )
            {
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, table, node, MISSING_ENDTAG_BEFORE );
                    TY_(UngetToken)( doc );
                    lexer->istackbase = istackbase;

                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
        }

        if (!(node->tag->model & CM_TABLE))
        {
            TY_(UngetToken)( doc );
            TY_(Report)(doc, table, node, TAG_NOT_ALLOWED_IN);
            lexer->istackbase = istackbase;

            DEBUG_LOG_EXIT;
            return NULL;
        }

        if (TY_(nodeIsElement)(node))
        {
            TidyParserMemory memory = {0};
            TY_(InsertNodeAtEnd)(table, node);
            memory.identity = TY_(ParseTableTag);
            memory.original_node = table;
            memory.reentry_node = node;
            memory.register_1 = lexer->exiled;
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }

        /* discard unexpected text nodes and end tags */
        TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, table, node, MISSING_ENDTAG_FOR);
    lexer->istackbase = istackbase;

    DEBUG_LOG_EXIT;
    return NULL;
}